

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_scalar_functions.hpp
# Opt level: O0

void sum_cols_int(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  StringRef capturedExpression;
  int iVar1;
  int iVar2;
  ExprLhs<const_int_&> this;
  undefined8 *in_RDX;
  int in_ESI;
  undefined8 in_RDI;
  int i;
  int sum;
  AssertionHandler catchAssertionHandler;
  size_t in_stack_ffffffffffffff08;
  ITransientExpression *expr;
  SourceLineInfo *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  int iVar3;
  undefined4 in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  char *in_stack_ffffffffffffff28;
  int *in_stack_ffffffffffffff30;
  ITransientExpression local_80;
  StringRef local_70;
  undefined8 *local_18;
  int local_c;
  undefined8 local_8;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  local_70 = operator____catch_sr((char *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  expr = &local_80;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)expr,
             "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/tools/sqlite3_api_wrapper/test/include/udf_scalar_functions.hpp"
             ,0xf);
  Catch::StringRef::StringRef
            ((StringRef *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  capturedExpression.m_size = (size_type)in_stack_ffffffffffffff30;
  capturedExpression.m_start = in_stack_ffffffffffffff28;
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             (StringRef *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
             in_stack_ffffffffffffff10,capturedExpression,(Flags)((ulong)expr >> 0x20));
  this = Catch::Decomposer::operator<=((Decomposer *)expr,(int *)0x22bc05);
  Catch::ExprLhs<int_const&>::operator>
            ((ExprLhs<const_int_&> *)this.m_lhs,in_stack_ffffffffffffff30);
  Catch::AssertionHandler::handleExpr((AssertionHandler *)this.m_lhs,expr);
  Catch::BinaryExpr<const_int_&,_const_int_&>::~BinaryExpr
            ((BinaryExpr<const_int_&,_const_int_&> *)0x22bc52);
  Catch::AssertionHandler::complete((AssertionHandler *)this.m_lhs);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)this.m_lhs);
  iVar1 = duckdb_shell_sqlite3_value_int(*local_18);
  for (iVar3 = 1; iVar3 < local_c; iVar3 = iVar3 + 1) {
    iVar2 = duckdb_shell_sqlite3_value_int(local_18[iVar3]);
    iVar1 = iVar2 + iVar1;
  }
  duckdb_shell_sqlite3_result_int(local_8,iVar1);
  return;
}

Assistant:

static void sum_cols_int(sqlite3_context *context, int argc, sqlite3_value **argv) {
	REQUIRE(argc > 0);
	auto sum = sqlite3_value_int(argv[0]);
	for (int i = 1; i < argc; ++i) {
		sum += sqlite3_value_int(argv[i]);
	}
	sqlite3_result_int(context, sum);
}